

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void idx2::Resize<idx2::array<idx2::v3<int>>>
               (array<idx2::array<idx2::v3<int>_>_> *Array,i64 NewSize)

{
  long lVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  if (Array->Capacity < NewSize) {
    GrowCapacity<idx2::array<idx2::v3<int>>>(Array,NewSize);
  }
  lVar1 = Array->Size;
  if (lVar1 < NewSize) {
    pbVar2 = (Array->Buffer).Data;
    if (Mallocator()::Instance == '\0') {
      Resize<idx2::array<idx2::v3<int>>>();
    }
    if (Mallocator()::Instance == '\0') {
      Resize<idx2::array<idx2::v3<int>>>();
    }
    if (lVar1 != NewSize) {
      pbVar3 = pbVar2 + lVar1 * 0x30;
      do {
        pbVar3[0] = '\0';
        pbVar3[1] = '\0';
        pbVar3[2] = '\0';
        pbVar3[3] = '\0';
        pbVar3[4] = '\0';
        pbVar3[5] = '\0';
        pbVar3[6] = '\0';
        pbVar3[7] = '\0';
        pbVar3[8] = '\0';
        pbVar3[9] = '\0';
        pbVar3[10] = '\0';
        pbVar3[0xb] = '\0';
        pbVar3[0xc] = '\0';
        pbVar3[0xd] = '\0';
        pbVar3[0xe] = '\0';
        pbVar3[0xf] = '\0';
        *(undefined8 **)(pbVar3 + 0x10) = &Mallocator()::Instance;
        pbVar3[0x18] = '\0';
        pbVar3[0x19] = '\0';
        pbVar3[0x1a] = '\0';
        pbVar3[0x1b] = '\0';
        pbVar3[0x1c] = '\0';
        pbVar3[0x1d] = '\0';
        pbVar3[0x1e] = '\0';
        pbVar3[0x1f] = '\0';
        pbVar3[0x20] = '\0';
        pbVar3[0x21] = '\0';
        pbVar3[0x22] = '\0';
        pbVar3[0x23] = '\0';
        pbVar3[0x24] = '\0';
        pbVar3[0x25] = '\0';
        pbVar3[0x26] = '\0';
        pbVar3[0x27] = '\0';
        *(undefined8 **)(pbVar3 + 0x28) = &Mallocator()::Instance;
        pbVar3 = pbVar3 + 0x30;
      } while (pbVar3 != pbVar2 + NewSize * 0x30);
    }
  }
  Array->Size = NewSize;
  return;
}

Assistant:

void
Resize(array<t>* Array, i64 NewSize)
{
  if (NewSize > Array->Capacity) // TODO: maybe grow the capacity until this is false
    GrowCapacity(Array, NewSize);
  if (Array->Size < NewSize)
    Fill(Begin(*Array) + Array->Size, Begin(*Array) + NewSize, t{});
  Array->Size = NewSize;
}